

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * __thiscall
RpiControlCore::process_package
          (string *__return_storage_ptr__,RpiControlCore *this,string *header,string *message)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  DeviceProperties *this_00;
  ulong uVar4;
  char *cmd;
  char *cmd_00;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> answer;
  string sStack_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  this_01 = &sStack_2d8;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = sw_str((header->_M_dataplus)._M_p,0);
  if (uVar3 == 0x9671e158) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"get-file",(allocator<char> *)&local_2b8);
    init_response(&sStack_2d8,&local_238);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&local_238);
    get_file(&sStack_2d8,message);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else if (uVar3 == 0x9cf09c18) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"shutdown-device",(allocator<char> *)&local_298);
    init_response(&local_2b8,&local_1f8);
    std::operator+(&sStack_2d8,&local_2b8,"OK");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_1f8);
    Utils::exec_abi_cxx11_(&local_58,(Utils *)"sudo shutdown",cmd);
    this_01 = &local_58;
  }
  else if (uVar3 == 0xac267199) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"exec-cmd",(allocator<char> *)&local_2b8);
    init_response(&sStack_2d8,&local_278);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&local_278);
    run_cmd(&sStack_2d8,message);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    this_01 = &sStack_2d8;
  }
  else if (uVar3 == 0xb06ebfb1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"set-device-name",(allocator<char> *)&local_298);
    init_response(&local_2b8,&local_1d8);
    std::operator+(&sStack_2d8,&local_2b8,"OK");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    Utils::exec_abi_cxx11_(&local_38,(Utils *)"sudo reboot",cmd_00);
    this_01 = &local_38;
  }
  else if (uVar3 == 0xb99b90dc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"get-eth-connection",(allocator<char> *)&local_2b8);
    init_response(&sStack_2d8,&local_258);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&local_258);
    get_eth_connection_abi_cxx11_();
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    this_01 = &sStack_2d8;
  }
  else if (uVar3 == 0xd07a872c) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"set-sound-volume",(allocator<char> *)&local_2b8);
    init_response(&sStack_2d8,&local_178);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&local_178);
    uVar4 = strtoul((message->_M_dataplus)._M_p,(char **)0x0,0);
    set_sound_volume((unsigned_short)uVar4);
    uVar2 = get_sound_volume();
    std::__cxx11::to_string(&sStack_2d8,(uint)uVar2);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    this_01 = &sStack_2d8;
  }
  else if (uVar3 == 0xd07a8738) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"get-sound-volume",(allocator<char> *)&local_2b8);
    init_response(&sStack_2d8,&local_158);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&local_158);
    uVar2 = get_sound_volume();
    std::__cxx11::to_string(&sStack_2d8,(uint)uVar2);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    this_01 = &sStack_2d8;
  }
  else if (uVar3 == 0x3c2a7b98) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"set-device-name",(allocator<char> *)&local_2b8);
    init_response(&sStack_2d8,&local_198);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&sStack_2d8);
    std::__cxx11::string::~string((string *)&local_198);
    set_device_name(&sStack_2d8,message);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    this_01 = &sStack_2d8;
  }
  else {
    if (uVar3 == 0x446f1da4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"set-new-password",(allocator<char> *)&local_2b8);
      init_response(&sStack_2d8,&local_1b8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
      std::__cxx11::string::~string((string *)&sStack_2d8);
      std::__cxx11::string::~string((string *)&local_1b8);
      change_password(message);
LAB_00106daf:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if (uVar3 == 0x52de5103) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"scanner",(allocator<char> *)&local_2b8);
      init_response(&sStack_2d8,&local_78);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
      std::__cxx11::string::~string((string *)&sStack_2d8);
      std::__cxx11::string::~string((string *)&local_78);
      bVar1 = std::operator==(message,"mikhnovich.oleg.rpicontrol");
      if (!bVar1) goto LAB_00106daf;
      this_00 = (DeviceProperties *)operator_new(0xa0);
      DeviceProperties::DeviceProperties(this_00);
      DeviceProperties::get_device_name_abi_cxx11_(&local_b8,this_00);
      std::operator+(&local_98,&local_b8,"|");
      DeviceProperties::get_device_model_abi_cxx11_(&local_d8,this_00);
      std::operator+(&local_298,&local_98,&local_d8);
      std::operator+(&local_2b8,&local_298,"|");
      DeviceProperties::get_os_version_abi_cxx11_(&local_f8,this_00);
      std::operator+(&sStack_2d8,&local_2b8,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      DeviceProperties::~DeviceProperties(this_00);
      operator_delete(this_00,0xa0);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      this_01 = &sStack_2d8;
    }
    else if (uVar3 == 0x6e044f21) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"get-dir",(allocator<char> *)&local_2b8);
      init_response(&sStack_2d8,&local_218);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
      std::__cxx11::string::~string((string *)&sStack_2d8);
      std::__cxx11::string::~string((string *)&local_218);
      get_dir(&sStack_2d8,message);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      this_01 = &sStack_2d8;
    }
    else {
      if (uVar3 != 0x791c5b1e) {
        if (uVar3 != 0x7c719bad) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"auth",(allocator<char> *)&local_2b8);
        init_response(&sStack_2d8,&local_118);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
        std::__cxx11::string::~string((string *)&sStack_2d8);
        std::__cxx11::string::~string((string *)&local_118);
        auth_user(message);
        goto LAB_00106daf;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"device-info",(allocator<char> *)&local_2b8);
      init_response(&sStack_2d8,&local_138);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2d8);
      std::__cxx11::string::~string((string *)&sStack_2d8);
      std::__cxx11::string::~string((string *)&local_138);
      get_device_info_abi_cxx11_();
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      this_01 = &sStack_2d8;
    }
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string RpiControlCore::process_package(std::string &header, std::string &message) {
    std::string response;

    switch (sw_str(header.data())) {
        case sw_str(H_SCANNER):
            response = init_response(H_SCANNER);
            if (message == PKG_MASK) {
                auto d = new DeviceProperties;
                auto answer = d->get_device_name() + "|" + d->get_device_model() + "|" + d->get_os_version();
                delete d;
                response += answer;
            } else {
                response += "ACCESS_DENY";
            }
            break;

        case sw_str(H_AUTH):
            response = init_response(H_AUTH);
            response += (auth_user(message)) ? "true" : "false";
            break;

        case sw_str(H_DEVICE_INFO):
            response = init_response(H_DEVICE_INFO);
            response += get_device_info();
            break;

        case sw_str(H_GET_SOUND_VOLUME):
            response = init_response(H_GET_SOUND_VOLUME);
            response += std::to_string(get_sound_volume());
            break;

        case sw_str(H_SET_SOUND_VOLUME):
            response = init_response(H_SET_SOUND_VOLUME);
            set_sound_volume(static_cast<unsigned short>( std::strtoul(message.c_str(), nullptr, 0)));
            response += std::to_string(get_sound_volume());
            break;

        case sw_str(H_SET_DEVICE_NAME):
            response = init_response(H_SET_DEVICE_NAME);
            response += set_device_name(message);
            break;

        case sw_str(H_SET_NEW_PASSWORD):
            response = init_response(H_SET_NEW_PASSWORD);
            response += (change_password(message)) ? "true" : "false";
            break;

        case sw_str(H_REBOOT_DEVICE):
            response = init_response(H_SET_DEVICE_NAME) + "OK";
            Utils::exec("sudo reboot");
            break;

        case sw_str(H_SHUTDOWN_DEVICE):
            response = init_response(H_SHUTDOWN_DEVICE) + "OK";
            Utils::exec("sudo shutdown");
            break;

        case sw_str(H_GET_DIR):
            response = init_response(H_GET_DIR);
            response += get_dir(message);
            break;

        case sw_str(H_GET_FILE):
            response = init_response(H_GET_FILE);
            response += get_file(message);
            break;

        case sw_str(H_GET_ETH_CONNECTION):
            response = init_response(H_GET_ETH_CONNECTION);
            response += get_eth_connection();
            break;

        case sw_str(H_EXEC_CMD):
            response = init_response(H_EXEC_CMD);
            response += run_cmd(message);
            break;

        default:
            break;
    }
    return response;
}